

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

FillStaticLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::FillStaticLayerParams>
          (Arena *arena)

{
  FillStaticLayerParams *pFVar1;
  
  if (arena != (Arena *)0x0) {
    pFVar1 = DoCreateMessage<CoreML::Specification::FillStaticLayerParams>(arena);
    return pFVar1;
  }
  pFVar1 = (FillStaticLayerParams *)operator_new(0x30);
  CoreML::Specification::FillStaticLayerParams::FillStaticLayerParams(pFVar1,(Arena *)0x0,false);
  return pFVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }